

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void d68020_divl(m68k_info *info)

{
  m68k_reg mVar1;
  ulong uVar2;
  m68k_reg mVar3;
  
  if ((info->type & 0x1c) != 0) {
    uVar2 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
    mVar3 = 0xaaaa;
    if (uVar2 + 2 <= info->code_len) {
      mVar3 = (m68k_reg)
              (ushort)(*(ushort *)(info->code + uVar2) << 8 | *(ushort *)(info->code + uVar2) >> 8);
    }
    info->pc = info->pc + 2;
    MCInst_setOpcode(info->inst,(uint)((mVar3 >> 0xb & 1) == 0) * 2 + 0x4c);
    (info->extension).op_count = '\x02';
    (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
    (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x4;
    get_ea_mode_op(info,(info->extension).operands,info->ir,4);
    mVar1 = mVar3 >> 0xc & M68K_REG_D6;
    (info->extension).operands[1].type = M68K_OP_REG_PAIR;
    (info->extension).operands[1].address_mode = M68K_AM_NONE;
    (info->extension).operands[1].field_0.reg = mVar3 & M68K_REG_D6;
    (info->extension).operands[1].field_0.reg_pair.reg_1 = mVar1;
    if (((byte)(mVar3 >> 10) & (mVar3 & M68K_REG_D6) != mVar1) == 0) {
      (info->extension).operands[1].type = M68K_OP_REG;
      (info->extension).operands[1].field_0.reg = mVar1 + M68K_REG_D0;
    }
    return;
  }
  build_imm(info,0,info->ir);
  return;
}

Assistant:

static void d68020_divl(m68k_info *info)
{
	uint extension, insn_signed;
	cs_m68k* ext;
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	uint reg_0, reg_1;

	LIMIT_CPU_TYPES(info, M68020_PLUS);

	extension = read_imm_16(info);
	insn_signed = 0;

	if (BIT_B((extension)))
		insn_signed = 1;

	ext = build_init_op(info, insn_signed ? M68K_INS_DIVS : M68K_INS_DIVU, 2, 4);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	get_ea_mode_op(info, op0, info->ir, 4);

	reg_0 = extension & 7;
	reg_1 = (extension >> 12) & 7;

	op1->address_mode = M68K_AM_NONE;
	op1->type = M68K_OP_REG_PAIR;
	op1->reg_pair.reg_0 = reg_0;
	op1->reg_pair.reg_1 = reg_1;

	if ((reg_0 == reg_1) || !BIT_A(extension)) {
		op1->type = M68K_OP_REG;
		op1->reg = M68K_REG_D0 + reg_1;
	}
}